

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_input.cpp
# Opt level: O2

any * __thiscall
Omega_h::InputYamlReader::at_shift
          (any *__return_storage_ptr__,InputYamlReader *this,int token,string *text)

{
  undefined1 *puVar1;
  
  if ((token == 0x13) || (token == 3)) {
    puVar1 = (undefined1 *)std::__cxx11::string::at((ulong)text);
    __return_storage_ptr__->vtable = (vtable_type *)any::vtable_for_type<char>()::table;
    *(undefined1 *)&__return_storage_ptr__->storage = *puVar1;
  }
  else if (token == 0) {
    any::construct<std::__cxx11::string>(__return_storage_ptr__,text);
  }
  else {
    __return_storage_ptr__->vtable = (vtable_type *)0x0;
  }
  return __return_storage_ptr__;
}

Assistant:

any at_shift(int token, std::string& text) override final {
    switch (token) {
      case yaml::TOK_NEWLINE: {
        return any(std::move(text));
      }
      case yaml::TOK_SPACE:
      case yaml::TOK_OTHER: {
        return text.at(0);
      }
    }
    return any();
  }